

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_complete(char *zSql)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  byte *pbVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  
  bVar3 = 0;
LAB_0013dbbc:
  bVar1 = *zSql;
  if (bVar1 < 0x27) {
    if (bVar1 < 0xc) {
      if (bVar1 - 9 < 2) goto LAB_0013dca0;
      if (bVar1 == 0) {
LAB_0013e1e9:
        bVar14 = bVar3 == 1;
        goto LAB_0013e1ee;
      }
    }
    else {
      if ((bVar1 - 0xc < 2) || (bVar1 == 0x20)) {
LAB_0013dca0:
        lVar10 = 1;
        goto LAB_0013dca2;
      }
      if (bVar1 == 0x22) goto LAB_0013dc75;
    }
LAB_0013dce1:
    if ((""[bVar1] & 0x46) == 0) {
LAB_0013ddcc:
      lVar10 = 2;
    }
    else {
      lVar13 = 0;
      lVar6 = -0x100000000;
      do {
        lVar6 = lVar6 + 0x100000000;
        lVar10 = lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while ((""[((byte *)zSql)[lVar10]] & 0x46) != 0);
      lVar10 = 2;
      uVar7 = (ulong)(bVar1 - 0x43);
      if (bVar1 - 0x43 < 0x32) {
        if ((0x100000001U >> (uVar7 & 0x3f) & 1) == 0) {
          iVar12 = (int)lVar13;
          pbVar4 = (byte *)zSql;
          if ((0x400000004U >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x2000000020000U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_0013e1c3;
            if (iVar12 == 4) {
              if ((byte *)zSql != (byte *)0x0) {
                lVar9 = 4;
                pcVar8 = "temp";
                lVar10 = 0;
                pbVar5 = (byte *)zSql;
                do {
                  if ((ulong)*pbVar5 == 0) {
                    pcVar8 = "temp" + lVar10;
                    goto LAB_0013e0bc;
                  }
                  if (""[*pbVar5] != ""[(byte)*pcVar8]) goto LAB_0013e0bc;
                  pbVar5 = pbVar5 + 1;
                  lVar10 = lVar10 + 1;
                  pcVar8 = (char *)((byte *)pcVar8 + 1);
                  lVar9 = lVar9 + -1;
                } while (lVar9 != 0);
                lVar9 = 0;
                pcVar8 = "";
                pbVar5 = (byte *)zSql + 4;
LAB_0013e0bc:
                lVar10 = 5;
                if (((int)lVar9 < 1) || (""[*pbVar5] == ""[(byte)*pcVar8])) goto LAB_0013e1c3;
              }
              if ((byte *)zSql != (byte *)0x0 && lVar13 == 9) {
LAB_0013e111:
                lVar13 = 9;
                pcVar8 = "temporary";
                lVar10 = 0;
                do {
                  if ((ulong)*pbVar4 == 0) {
                    pcVar8 = "temporary" + lVar10;
                    goto LAB_0013e18b;
                  }
                  if (""[*pbVar4] != ""[(byte)*pcVar8]) goto LAB_0013e18b;
                  pbVar4 = pbVar4 + 1;
                  lVar10 = lVar10 + 1;
                  pcVar8 = (char *)((byte *)pcVar8 + 1);
                  lVar13 = lVar13 + -1;
                } while (lVar13 != 0);
                lVar13 = 0;
                pcVar8 = "";
                pbVar4 = (byte *)zSql + 9;
LAB_0013e18b:
                lVar10 = 5;
                if ((int)lVar13 < 1) goto LAB_0013e1c3;
LAB_0013e19f:
                bVar14 = ""[*pbVar4] == ""[(byte)*pcVar8];
                goto LAB_0013e1af;
              }
            }
            else if (iVar12 == 9) {
              if ((byte *)zSql != (byte *)0x0) goto LAB_0013e111;
            }
            else if ((iVar12 == 7) && ((byte *)zSql != (byte *)0x0)) {
              lVar13 = 7;
              pcVar8 = "trigger";
              lVar10 = 0;
              do {
                if ((ulong)*pbVar4 == 0) {
                  pcVar8 = "trigger" + lVar10;
                  goto LAB_0013dffc;
                }
                if (""[*pbVar4] != ""[(byte)*pcVar8]) goto LAB_0013dffc;
                pbVar4 = pbVar4 + 1;
                lVar10 = lVar10 + 1;
                pcVar8 = (char *)((byte *)pcVar8 + 1);
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              lVar13 = 0;
              pcVar8 = "";
              pbVar4 = (byte *)zSql + 7;
LAB_0013dffc:
              lVar10 = 6;
              if (((int)lVar13 < 1) || (""[*pbVar4] == ""[(byte)*pcVar8])) goto LAB_0013e1c3;
            }
          }
          else if (iVar12 == 7) {
            if ((byte *)zSql != (byte *)0x0) {
LAB_0013df71:
              lVar13 = 7;
              pcVar8 = "explain";
              lVar10 = 0;
              do {
                if ((ulong)*pbVar4 == 0) {
                  pcVar8 = "explain" + lVar10;
                  goto LAB_0013dfcb;
                }
                if (""[*pbVar4] != ""[(byte)*pcVar8]) goto LAB_0013dfcb;
                pbVar4 = pbVar4 + 1;
                lVar10 = lVar10 + 1;
                pcVar8 = (char *)((byte *)pcVar8 + 1);
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
              lVar13 = 0;
              pcVar8 = "";
              pbVar4 = (byte *)zSql + 7;
LAB_0013dfcb:
              lVar10 = 3;
              if (0 < (int)lVar13) goto LAB_0013e19f;
              goto LAB_0013e1c3;
            }
          }
          else if (iVar12 == 3) {
            if ((byte *)zSql != (byte *)0x0) {
              lVar9 = 3;
              pbVar11 = (byte *)0x1f5b08;
              lVar10 = 0;
              pbVar5 = (byte *)zSql;
              do {
                if ((ulong)*pbVar5 == 0) {
                  pbVar11 = (byte *)("greatest_info.end" + lVar10 + 0xe);
                  goto LAB_0013df1c;
                }
                if (""[*pbVar5] != ""[*pbVar11]) goto LAB_0013df1c;
                pbVar5 = pbVar5 + 1;
                lVar10 = lVar10 + 1;
                pbVar11 = pbVar11 + 1;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
              lVar9 = 0;
              pbVar11 = (byte *)0x1f5b0b;
              pbVar5 = (byte *)zSql + 3;
LAB_0013df1c:
              lVar10 = 7;
              if (((int)lVar9 < 1) || (""[*pbVar5] == ""[*pbVar11])) goto LAB_0013e1c3;
            }
            if ((byte *)zSql != (byte *)0x0 && lVar13 == 7) goto LAB_0013df71;
          }
LAB_0013e1b8:
          lVar10 = 2;
        }
        else {
          if ((byte *)zSql == (byte *)0x0 || lVar13 != 6) goto LAB_0013e1b8;
          lVar13 = 6;
          pcVar8 = "create";
          lVar10 = 0;
          pbVar4 = (byte *)zSql;
          do {
            if ((ulong)*pbVar4 == 0) {
              pcVar8 = "create" + lVar10;
              goto LAB_0013deda;
            }
            if (""[*pbVar4] != ""[(byte)*pcVar8]) goto LAB_0013deda;
            pbVar4 = pbVar4 + 1;
            lVar10 = lVar10 + 1;
            pcVar8 = (char *)((byte *)pcVar8 + 1);
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
          lVar13 = 0;
          pcVar8 = "";
          pbVar4 = (byte *)zSql + 6;
LAB_0013deda:
          lVar10 = 4;
          if (0 < (int)lVar13) {
            bVar14 = ""[*pbVar4] == ""[(byte)*pcVar8];
LAB_0013e1af:
            if (!bVar14) goto LAB_0013e1b8;
          }
        }
      }
LAB_0013e1c3:
      zSql = (char *)((byte *)zSql + (lVar6 >> 0x20));
    }
  }
  else if (bVar1 < 0x3b) {
    if (bVar1 == 0x27) {
LAB_0013dc75:
      do {
        bVar2 = ((byte *)zSql)[1];
        zSql = (char *)((byte *)zSql + 1);
        if (bVar2 == 0) break;
      } while (bVar2 != bVar1);
      if (bVar2 != 0) {
        lVar10 = 2;
        goto LAB_0013dca2;
      }
LAB_0013e1e5:
      bVar14 = false;
LAB_0013e1ee:
      return (int)bVar14;
    }
    if (bVar1 == 0x2d) {
      lVar10 = 2;
      if (((byte *)zSql)[1] == 0x2d) {
        while( true ) {
          if (*zSql == 0) goto LAB_0013e1e9;
          if (*zSql == 10) break;
          zSql = (char *)((byte *)zSql + 1);
        }
        goto LAB_0013dca0;
      }
    }
    else {
      if (bVar1 != 0x2f) goto LAB_0013dce1;
      lVar10 = 2;
      if (((byte *)zSql)[1] == 0x2a) {
        zSql = (char *)((byte *)zSql + 3);
        do {
          if (((byte *)zSql)[-1] == 0x2a) {
            if (*zSql == 0x2f) goto LAB_0013ddd3;
          }
          else if (((byte *)zSql)[-1] == 0) goto LAB_0013e1e5;
          zSql = (char *)((byte *)zSql + 1);
        } while( true );
      }
    }
  }
  else {
    if (bVar1 != 0x3b) {
      if (bVar1 == 0x60) goto LAB_0013dc75;
      if (bVar1 != 0x5b) goto LAB_0013dce1;
      do {
        pbVar4 = (byte *)zSql + 1;
        if (*pbVar4 == 0) goto LAB_0013e1e5;
        zSql = (char *)((byte *)zSql + 1);
      } while (*pbVar4 != 0x5d);
      goto LAB_0013ddcc;
    }
    lVar10 = 0;
  }
LAB_0013dca2:
  bVar3 = sqlite3_complete::trans[bVar3][lVar10];
  zSql = (char *)((byte *)zSql + 1);
  goto LAB_0013dbbc;
LAB_0013ddd3:
  lVar10 = 1;
  goto LAB_0013dca2;
}

Assistant:

SQLITE_API int sqlite3_complete(const char *zSql){
  u8 state = 0;   /* Current state, using numbers defined in header comment */
  u8 token;       /* Value of the next token */

#ifndef SQLITE_OMIT_TRIGGER
  /* A complex statement machine used to detect the end of a CREATE TRIGGER
  ** statement.  This is the normal case.
  */
  static const u8 trans[8][8] = {
                     /* Token:                                                */
     /* State:       **  SEMI  WS  OTHER  EXPLAIN  CREATE  TEMP  TRIGGER  END */
     /* 0 INVALID: */ {    1,  0,     2,       3,      4,    2,       2,   2, },
     /* 1   START: */ {    1,  1,     2,       3,      4,    2,       2,   2, },
     /* 2  NORMAL: */ {    1,  2,     2,       2,      2,    2,       2,   2, },
     /* 3 EXPLAIN: */ {    1,  3,     3,       2,      4,    2,       2,   2, },
     /* 4  CREATE: */ {    1,  4,     2,       2,      2,    4,       5,   2, },
     /* 5 TRIGGER: */ {    6,  5,     5,       5,      5,    5,       5,   5, },
     /* 6    SEMI: */ {    6,  6,     5,       5,      5,    5,       5,   7, },
     /* 7     END: */ {    1,  7,     5,       5,      5,    5,       5,   5, },
  };
#else
  /* If triggers are not supported by this compile then the statement machine
  ** used to detect the end of a statement is much simpler
  */
  static const u8 trans[3][3] = {
                     /* Token:           */
     /* State:       **  SEMI  WS  OTHER */
     /* 0 INVALID: */ {    1,  0,     2, },
     /* 1   START: */ {    1,  1,     2, },
     /* 2  NORMAL: */ {    1,  2,     2, },
  };
#endif /* SQLITE_OMIT_TRIGGER */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zSql==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  while( *zSql ){
    switch( *zSql ){
      case ';': {  /* A semicolon */
        token = tkSEMI;
        break;
      }
      case ' ':
      case '\r':
      case '\t':
      case '\n':
      case '\f': {  /* White space is ignored */
        token = tkWS;
        break;
      }
      case '/': {   /* C-style comments */
        if( zSql[1]!='*' ){
          token = tkOTHER;
          break;
        }
        zSql += 2;
        while( zSql[0] && (zSql[0]!='*' || zSql[1]!='/') ){ zSql++; }
        if( zSql[0]==0 ) return 0;
        zSql++;
        token = tkWS;
        break;
      }
      case '-': {   /* SQL-style comments from "--" to end of line */
        if( zSql[1]!='-' ){
          token = tkOTHER;
          break;
        }
        while( *zSql && *zSql!='\n' ){ zSql++; }
        if( *zSql==0 ) return state==1;
        token = tkWS;
        break;
      }
      case '[': {   /* Microsoft-style identifiers in [...] */
        zSql++;
        while( *zSql && *zSql!=']' ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      case '`':     /* Grave-accent quoted symbols used by MySQL */
      case '"':     /* single- and double-quoted strings */
      case '\'': {
        int c = *zSql;
        zSql++;
        while( *zSql && *zSql!=c ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      default: {
#ifdef SQLITE_EBCDIC
        unsigned char c;
#endif
        if( IdChar((u8)*zSql) ){
          /* Keywords and unquoted identifiers */
          int nId;
          for(nId=1; IdChar(zSql[nId]); nId++){}
#ifdef SQLITE_OMIT_TRIGGER
          token = tkOTHER;
#else
          switch( *zSql ){
            case 'c': case 'C': {
              if( nId==6 && sqlite3StrNICmp(zSql, "create", 6)==0 ){
                token = tkCREATE;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 't': case 'T': {
              if( nId==7 && sqlite3StrNICmp(zSql, "trigger", 7)==0 ){
                token = tkTRIGGER;
              }else if( nId==4 && sqlite3StrNICmp(zSql, "temp", 4)==0 ){
                token = tkTEMP;
              }else if( nId==9 && sqlite3StrNICmp(zSql, "temporary", 9)==0 ){
                token = tkTEMP;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 'e':  case 'E': {
              if( nId==3 && sqlite3StrNICmp(zSql, "end", 3)==0 ){
                token = tkEND;
              }else
#ifndef SQLITE_OMIT_EXPLAIN
              if( nId==7 && sqlite3StrNICmp(zSql, "explain", 7)==0 ){
                token = tkEXPLAIN;
              }else
#endif
              {
                token = tkOTHER;
              }
              break;
            }
            default: {
              token = tkOTHER;
              break;
            }
          }
#endif /* SQLITE_OMIT_TRIGGER */
          zSql += nId-1;
        }else{
          /* Operators and special symbols */
          token = tkOTHER;
        }
        break;
      }
    }
    state = trans[state][token];
    zSql++;
  }
  return state==1;
}